

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O1

void __thiscall Utils::ArgumentParser::~ArgumentParser(ArgumentParser *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppVVar3;
  pointer ppAVar4;
  pointer pcVar5;
  _Base_ptr p_Var6;
  pointer ppVVar7;
  pointer ppAVar8;
  long *local_50 [2];
  long local_40 [2];
  undefined8 local_30;
  
  ppVVar3 = (this->positionals).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar7 = (this->positionals).
                 super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVVar7 != ppVVar3; ppVVar7 = ppVVar7 + 1
      ) {
    if (*ppVVar7 != (ValueArgObj *)0x0) {
      (*((*ppVVar7)->super_ArgObject)._vptr_ArgObject[1])();
    }
  }
  ppVVar3 = (this->options).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar7 = (this->options).
                 super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVVar7 != ppVVar3; ppVVar7 = ppVVar7 + 1
      ) {
    if (*ppVVar7 != (ValueArgObj *)0x0) {
      (*((*ppVVar7)->super_ArgObject)._vptr_ArgObject[1])();
    }
  }
  ppAVar4 = (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar8 = (this->flags).
                 super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppAVar8 != ppAVar4; ppAVar8 = ppAVar8 + 1) {
    if (*ppAVar8 != (ArgFlag *)0x0) {
      (*((*ppAVar8)->super_ArgObject)._vptr_ArgObject[1])();
    }
  }
  p_Var6 = (this->option_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->option_mapping)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,*(long *)(p_Var6 + 1),
                 (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
      local_30 = 0;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  p_Var6 = (this->flag_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->flag_mapping)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,*(long *)(p_Var6 + 1),
                 (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
      local_30 = 0;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  pcVar5 = (this->long_text)._M_dataplus._M_p;
  paVar2 = &(this->long_text).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar2) {
    operator_delete(pcVar5,paVar2->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->short_text)._M_dataplus._M_p;
  paVar2 = &(this->short_text).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar2) {
    operator_delete(pcVar5,paVar2->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->program_name)._M_dataplus._M_p;
  paVar2 = &(this->program_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar2) {
    operator_delete(pcVar5,paVar2->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>_>_>
  ::~_Rb_tree(&(this->flag_mapping)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>_>_>
  ::~_Rb_tree(&(this->option_mapping)._M_t);
  ppAVar8 = (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar8 != (pointer)0x0) {
    operator_delete(ppAVar8,(long)(this->flags).
                                  super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar8
                   );
  }
  ppVVar7 = (this->options).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar7 != (pointer)0x0) {
    operator_delete(ppVVar7,(long)(this->options).
                                  super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar7
                   );
  }
  ppVVar7 = (this->positionals).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar7 != (pointer)0x0) {
    operator_delete(ppVVar7,(long)(this->positionals).
                                  super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar7
                   );
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->used_identifier)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
  return;
}

Assistant:

inline ArgumentParser::~ArgumentParser() {
    for ( auto i : positionals ) delete i;
    for ( auto i : options  )    delete i;
    for ( auto i : flags )       delete i;

    for ( auto i : option_mapping ) i.second = nullptr;
    for ( auto i : flag_mapping )   i.second = nullptr;
}